

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor.h
# Opt level: O0

void __thiscall FastPForLib::PFor::PFor(PFor *this)

{
  IntegerCODEC *in_RDI;
  allocator_type *__a;
  undefined1 *__n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffe0;
  undefined1 local_9 [9];
  
  IntegerCODEC::IntegerCODEC(in_RDI);
  in_RDI->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_00480e78;
  __a = (allocator_type *)(in_RDI + 1);
  __n = local_9;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x14e4c3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffe0,(size_type)__n,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x14e4e3);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x14e4ff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffe0,(size_type)__n,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x14e51e);
  return;
}

Assistant:

PFor() : codedcopy(BlockSize), miss(BlockSize) {}